

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_sh.cpp
# Opt level: O2

bool __thiscall CmdSh::Execute(CmdSh *this)

{
  char cVar1;
  bool bVar2;
  ostream *poVar3;
  CommandSptr cmd;
  string s;
  value_type fileName;
  string local_258 [32];
  ifstream fin;
  byte abStack_218 [488];
  
  if ((this->super_Command).option.
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node._M_size == 0) {
    std::__cxx11::string::string
              ((string *)&fileName,
               (string *)
               ((this->super_Command).parameter.
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl._M_node.super__List_node_base._M_next + 1));
    std::ifstream::ifstream(&fin,(string *)&fileName,_S_in);
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 == '\0') {
      poVar3 = std::operator<<((ostream *)&std::cout,"sh: cannot stat \'");
      poVar3 = std::operator<<(poVar3,(string *)&fileName);
      poVar3 = std::operator<<(poVar3,"\': No such fileName or directory");
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    else {
      while ((abStack_218[*(long *)(_fin + -0x18)] & 2) == 0) {
        s._M_dataplus._M_p = (pointer)&s.field_2;
        s._M_string_length = 0;
        s.field_2._M_local_buf[0] = '\0';
        std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&fin,(string *)&s)
        ;
        bVar2 = std::operator==(&s,"exit");
        if (bVar2) {
          std::__cxx11::string::~string((string *)&s);
          break;
        }
        std::__cxx11::string::string(local_258,(string *)&s);
        CmdParser::Parse((CmdParser *)&cmd,(string *)&this->field_0x38);
        std::__cxx11::string::~string(local_258);
        if (cmd.super___shared_ptr<Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          (**(cmd.super___shared_ptr<Command,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_Command)();
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&cmd.super___shared_ptr<Command,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__cxx11::string::~string((string *)&s);
      }
    }
    std::ifstream::~ifstream(&fin);
    std::__cxx11::string::~string((string *)&fileName);
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"sh: invalid option");
    std::endl<char,std::char_traits<char>>(poVar3);
    cVar1 = '\0';
  }
  return (bool)cVar1;
}

Assistant:

bool CmdSh::Execute(){
	if(option.size() != 0){
		cout << "sh: invalid option" << endl;
		return false;
	}
	
	auto fileName = parameter.front();
	ifstream fin(fileName);
	if(!fin.is_open()){
		cout << "sh: cannot stat '" << fileName << "': No such fileName or directory" << endl;
		return false;
	}

	while(!fin.eof()){
		string s;
		getline(fin, s);
		if(s == "exit")break;
		auto cmd = cmdPsr.Parse(s);
		if(cmd != nullptr)cmd->Execute();
	}

	return true;
}